

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

size_t lj_gc_separateudata(global_State *g,int all)

{
  GCtab *mt;
  cTValue *pcVar1;
  uint32_t uVar2;
  int in_ESI;
  long in_RDI;
  GCobj *root;
  GCobj *o;
  GCRef *p;
  size_t m;
  GCstr *in_stack_ffffffffffffffc8;
  uint32_t *in_stack_ffffffffffffffd0;
  GCtab *local_20;
  size_t local_18;
  
  local_18 = 0;
  mt = (GCtab *)(ulong)*(uint *)(in_RDI + 0x110);
  while (local_20 = mt, mt = (GCtab *)(ulong)(local_20->nextgc).gcptr32, mt != (GCtab *)0x0) {
    if ((((mt->marked & 3) != 0) || (in_ESI != 0)) && ((mt->marked & 8) == 0)) {
      if ((((mt->metatable).gcptr32 == 0) ||
          ((*(byte *)((ulong)(mt->metatable).gcptr32 + 6) & 4) != 0)) ||
         (pcVar1 = lj_meta_cache(mt,(MMS)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                                 in_stack_ffffffffffffffc8), pcVar1 == (cTValue *)0x0)) {
        mt->marked = mt->marked | 8;
      }
      else {
        local_18 = (ulong)(mt->gclist).gcptr32 + 0x18 + local_18;
        mt->marked = mt->marked | 8;
        (local_20->nextgc).gcptr32 = (mt->nextgc).gcptr32;
        uVar2 = (uint32_t)mt;
        if (*(int *)(in_RDI + 0x74) == 0) {
          (mt->nextgc).gcptr32 = uVar2;
          *(uint32_t *)(in_RDI + 0x74) = uVar2;
          mt = local_20;
        }
        else {
          in_stack_ffffffffffffffd0 = (uint32_t *)(ulong)*(uint *)(in_RDI + 0x74);
          (mt->nextgc).gcptr32 = *in_stack_ffffffffffffffd0;
          *in_stack_ffffffffffffffd0 = uVar2;
          *(uint32_t *)(in_RDI + 0x74) = uVar2;
          mt = local_20;
        }
      }
    }
  }
  return local_18;
}

Assistant:

size_t lj_gc_separateudata(global_State *g, int all)
{
  size_t m = 0;
  GCRef *p = &mainthread(g)->nextgc;
  GCobj *o;
  while ((o = gcref(*p)) != NULL) {
    if (!(iswhite(o) || all) || isfinalized(gco2ud(o))) {
      p = &o->gch.nextgc;  /* Nothing to do. */
    } else if (!lj_meta_fastg(g, tabref(gco2ud(o)->metatable), MM_gc)) {
      markfinalized(o);  /* Done, as there's no __gc metamethod. */
      p = &o->gch.nextgc;
    } else {  /* Otherwise move userdata to be finalized to mmudata list. */
      m += sizeudata(gco2ud(o));
      markfinalized(o);
      *p = o->gch.nextgc;
      if (gcref(g->gc.mmudata)) {  /* Link to end of mmudata list. */
	GCobj *root = gcref(g->gc.mmudata);
	setgcrefr(o->gch.nextgc, root->gch.nextgc);
	setgcref(root->gch.nextgc, o);
	setgcref(g->gc.mmudata, o);
      } else {  /* Create circular list. */
	setgcref(o->gch.nextgc, o);
	setgcref(g->gc.mmudata, o);
      }
    }
  }
  return m;
}